

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_lex.c
# Opt level: O0

yajl_tok yajl_lex_lex(yajl_lexer lexer,uchar *jsonText,size_t jsonTextLen,size_t *offset,
                     uchar **outBuf,size_t *outLen)

{
  char *pcVar1;
  uchar uVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  size_t *psVar6;
  ulong jsonTextLen_00;
  uchar *puVar7;
  size_t sVar8;
  ulong *in_RCX;
  ulong in_RDX;
  size_t *in_RSI;
  size_t in_RDI;
  long *in_R8;
  yajl_lexer in_R9;
  uchar *unaff_retaddr;
  yajl_lexer in_stack_00000008;
  char *want_2;
  char *want_1;
  char *want;
  size_t startOffset;
  uchar c;
  yajl_tok tok;
  void *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  uint local_8c;
  uint local_7c;
  size_t *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  char *pcVar9;
  uchar *in_stack_ffffffffffffffb0;
  yajl_lexer in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar10;
  yajl_tok yVar11;
  
  uVar10 = 4;
  jsonTextLen_00 = *in_RCX;
  *in_R8 = 0;
  in_R9->lineOff = 0;
  while (*in_RCX < in_RDX) {
    if ((*(int *)(in_RDI + 0x28) == 0) ||
       (sVar8 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar8 == 0)) {
LAB_00102eaf:
      uVar5 = *in_RCX;
      *in_RCX = uVar5 + 1;
      uVar2 = *(uchar *)((long)in_RSI + uVar5);
    }
    else {
      in_stack_ffffffffffffffa0 = *(size_t **)(in_RDI + 0x20);
      psVar6 = (size_t *)yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18));
      if (psVar6 <= in_stack_ffffffffffffffa0) goto LAB_00102eaf;
      puVar7 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
      lVar4 = *(long *)(in_RDI + 0x20);
      *(long *)(in_RDI + 0x20) = lVar4 + 1;
      uVar2 = puVar7[lVar4];
    }
    in_stack_ffffffffffffffc8 = CONCAT13(uVar2,(int3)in_stack_ffffffffffffffc8);
    switch(uVar2) {
    case '\t':
    case '\n':
    case '\v':
    case '\f':
    case '\r':
    case ' ':
      jsonTextLen_00 = jsonTextLen_00 + 1;
      break;
    default:
      *(undefined4 *)(in_RDI + 0x10) = 5;
      yVar11 = yajl_tok_error;
      goto LAB_00103530;
    case '\"':
      yVar11 = yajl_lex_string(in_R9,(uchar *)CONCAT44(uVar10,in_stack_ffffffffffffffc8),
                               jsonTextLen_00,&in_stack_ffffffffffffffb8->lineOff);
      goto LAB_00103530;
    case ',':
      yVar11 = yajl_tok_comma;
      goto LAB_00103530;
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      if (*in_RCX == 0) {
        *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -1;
      }
      else {
        *in_RCX = *in_RCX - 1;
      }
      yVar11 = yajl_lex_number(in_stack_00000008,unaff_retaddr,in_RDI,in_RSI);
      goto LAB_00103530;
    case '/':
      if (*(int *)(in_RDI + 0x2c) == 0) {
        if (*in_RCX == 0) {
          *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -1;
        }
        else {
          *in_RCX = *in_RCX - 1;
        }
        *(undefined4 *)(in_RDI + 0x10) = 10;
        yVar11 = yajl_tok_error;
        goto LAB_00103530;
      }
      yVar11 = yajl_lex_comment(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      if (yVar11 != yajl_tok_comment) goto LAB_00103530;
      uVar10 = 4;
      yajl_buf_clear(*(yajl_buf *)(in_RDI + 0x18));
      *(undefined4 *)(in_RDI + 0x28) = 0;
      jsonTextLen_00 = *in_RCX;
      break;
    case ':':
      yVar11 = yajl_tok_colon;
      goto LAB_00103530;
    case '[':
      yVar11 = yajl_tok_left_brace;
      goto LAB_00103530;
    case ']':
      yVar11 = yajl_tok_right_brace;
      goto LAB_00103530;
    case 'f':
      pcVar9 = "alse";
      goto LAB_001030e4;
    case 'n':
      pcVar9 = "ull";
      goto LAB_00103252;
    case 't':
      pcVar9 = "rue";
      goto LAB_00102f76;
    case '{':
      yVar11 = yajl_tok_left_bracket;
      goto LAB_00103530;
    case '}':
      yVar11 = yajl_tok_right_bracket;
      goto LAB_00103530;
    }
  }
  yVar11 = yajl_tok_eof;
  goto LAB_00103530;
  while (pcVar1 = pcVar9 + 1, pcVar9 = pcVar9 + 1, *pcVar1 != '\0') {
LAB_00102f76:
    if (in_RDX <= *in_RCX) {
      yVar11 = yajl_tok_eof;
      goto LAB_00103530;
    }
    if (((*(int *)(in_RDI + 0x28) == 0) ||
        (sVar8 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar8 == 0)) ||
       (uVar5 = *(ulong *)(in_RDI + 0x20), sVar8 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
       sVar8 <= uVar5)) {
      uVar5 = *in_RCX;
      *in_RCX = uVar5 + 1;
      bVar3 = *(byte *)((long)in_RSI + uVar5);
    }
    else {
      puVar7 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
      lVar4 = *(long *)(in_RDI + 0x20);
      *(long *)(in_RDI + 0x20) = lVar4 + 1;
      bVar3 = puVar7[lVar4];
    }
    local_7c = (uint)bVar3;
    if (local_7c != (int)*pcVar9) {
      if (*in_RCX == 0) {
        *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -1;
      }
      else {
        *in_RCX = *in_RCX - 1;
      }
      *(undefined4 *)(in_RDI + 0x10) = 6;
      yVar11 = yajl_tok_error;
      goto LAB_00103530;
    }
  }
  yVar11 = yajl_tok_bool;
  goto LAB_00103530;
  while (pcVar1 = pcVar9 + 1, pcVar9 = pcVar9 + 1, *pcVar1 != '\0') {
LAB_00103252:
    if (in_RDX <= *in_RCX) {
      yVar11 = yajl_tok_eof;
      goto LAB_00103530;
    }
    if (((*(int *)(in_RDI + 0x28) == 0) ||
        (sVar8 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar8 == 0)) ||
       (uVar5 = *(ulong *)(in_RDI + 0x20), sVar8 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
       sVar8 <= uVar5)) {
      uVar5 = *in_RCX;
      *in_RCX = uVar5 + 1;
      bVar3 = *(byte *)((long)in_RSI + uVar5);
    }
    else {
      puVar7 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
      lVar4 = *(long *)(in_RDI + 0x20);
      *(long *)(in_RDI + 0x20) = lVar4 + 1;
      bVar3 = puVar7[lVar4];
    }
    in_stack_ffffffffffffff64 = (uint)bVar3;
    if (in_stack_ffffffffffffff64 != (int)*pcVar9) {
      if (*in_RCX == 0) {
        *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -1;
      }
      else {
        *in_RCX = *in_RCX - 1;
      }
      *(undefined4 *)(in_RDI + 0x10) = 6;
      yVar11 = yajl_tok_error;
      goto LAB_00103530;
    }
  }
  yVar11 = yajl_tok_null;
  goto LAB_00103530;
  while (pcVar1 = pcVar9 + 1, pcVar9 = pcVar9 + 1, *pcVar1 != '\0') {
LAB_001030e4:
    if (in_RDX <= *in_RCX) {
      yVar11 = yajl_tok_eof;
      goto LAB_00103530;
    }
    if (((*(int *)(in_RDI + 0x28) == 0) ||
        (sVar8 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar8 == 0)) ||
       (uVar5 = *(ulong *)(in_RDI + 0x20), sVar8 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
       sVar8 <= uVar5)) {
      uVar5 = *in_RCX;
      *in_RCX = uVar5 + 1;
      bVar3 = *(byte *)((long)in_RSI + uVar5);
    }
    else {
      puVar7 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
      lVar4 = *(long *)(in_RDI + 0x20);
      *(long *)(in_RDI + 0x20) = lVar4 + 1;
      bVar3 = puVar7[lVar4];
    }
    local_8c = (uint)bVar3;
    if (local_8c != (int)*pcVar9) {
      if (*in_RCX == 0) {
        *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -1;
      }
      else {
        *in_RCX = *in_RCX - 1;
      }
      *(undefined4 *)(in_RDI + 0x10) = 6;
      yVar11 = yajl_tok_error;
      goto LAB_00103530;
    }
  }
  yVar11 = yajl_tok_bool;
LAB_00103530:
  if ((yVar11 == yajl_tok_eof) || (*(int *)(in_RDI + 0x28) != 0)) {
    if (*(int *)(in_RDI + 0x28) == 0) {
      yajl_buf_clear(*(yajl_buf *)(in_RDI + 0x18));
    }
    *(undefined4 *)(in_RDI + 0x28) = 1;
    yajl_buf_append((yajl_buf)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff58,0x1035a5);
    *(undefined8 *)(in_RDI + 0x20) = 0;
    if (yVar11 != yajl_tok_eof) {
      puVar7 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
      *in_R8 = (long)puVar7;
      sVar8 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18));
      in_R9->lineOff = sVar8;
      *(undefined4 *)(in_RDI + 0x28) = 0;
    }
  }
  else if (yVar11 != yajl_tok_error) {
    *in_R8 = (long)in_RSI + jsonTextLen_00;
    in_R9->lineOff = *in_RCX - jsonTextLen_00;
  }
  if ((yVar11 == yajl_tok_string) || (yVar11 == yajl_tok_string_with_escapes)) {
    *in_R8 = *in_R8 + 1;
    in_R9->lineOff = in_R9->lineOff - 2;
  }
  return yVar11;
}

Assistant:

yajl_tok
yajl_lex_lex(yajl_lexer lexer, const unsigned char * jsonText,
             size_t jsonTextLen, size_t * offset,
             const unsigned char ** outBuf, size_t * outLen)
{
    yajl_tok tok = yajl_tok_error;
    unsigned char c;
    size_t startOffset = *offset;

    *outBuf = NULL;
    *outLen = 0;

    for (;;) {
        assert(*offset <= jsonTextLen);

        if (*offset >= jsonTextLen) {
            tok = yajl_tok_eof;
            goto lexed;
        }

        c = readChar(lexer, jsonText, offset);

        switch (c) {
            case '{':
                tok = yajl_tok_left_bracket;
                goto lexed;
            case '}':
                tok = yajl_tok_right_bracket;
                goto lexed;
            case '[':
                tok = yajl_tok_left_brace;
                goto lexed;
            case ']':
                tok = yajl_tok_right_brace;
                goto lexed;
            case ',':
                tok = yajl_tok_comma;
                goto lexed;
            case ':':
                tok = yajl_tok_colon;
                goto lexed;
            case '\t': case '\n': case '\v': case '\f': case '\r': case ' ':
                startOffset++;
                break;
            case 't': {
                const char * want = "rue";
                do {
                    if (*offset >= jsonTextLen) {
                        tok = yajl_tok_eof;
                        goto lexed;
                    }
                    c = readChar(lexer, jsonText, offset);
                    if (c != *want) {
                        unreadChar(lexer, offset);
                        lexer->error = yajl_lex_invalid_string;
                        tok = yajl_tok_error;
                        goto lexed;
                    }
                } while (*(++want));
                tok = yajl_tok_bool;
                goto lexed;
            }
            case 'f': {
                const char * want = "alse";
                do {
                    if (*offset >= jsonTextLen) {
                        tok = yajl_tok_eof;
                        goto lexed;
                    }
                    c = readChar(lexer, jsonText, offset);
                    if (c != *want) {
                        unreadChar(lexer, offset);
                        lexer->error = yajl_lex_invalid_string;
                        tok = yajl_tok_error;
                        goto lexed;
                    }
                } while (*(++want));
                tok = yajl_tok_bool;
                goto lexed;
            }
            case 'n': {
                const char * want = "ull";
                do {
                    if (*offset >= jsonTextLen) {
                        tok = yajl_tok_eof;
                        goto lexed;
                    }
                    c = readChar(lexer, jsonText, offset);
                    if (c != *want) {
                        unreadChar(lexer, offset);
                        lexer->error = yajl_lex_invalid_string;
                        tok = yajl_tok_error;
                        goto lexed;
                    }
                } while (*(++want));
                tok = yajl_tok_null;
                goto lexed;
            }
            case '"': {
                tok = yajl_lex_string(lexer, (const unsigned char *) jsonText,
                                      jsonTextLen, offset);
                goto lexed;
            }
            case '-':
            case '0': case '1': case '2': case '3': case '4':
            case '5': case '6': case '7': case '8': case '9': {
                /* integer parsing wants to start from the beginning */
                unreadChar(lexer, offset);
                tok = yajl_lex_number(lexer, (const unsigned char *) jsonText,
                                      jsonTextLen, offset);
                goto lexed;
            }
            case '/':
                /* hey, look, a probable comment!  If comments are disabled
                 * it's an error. */
                if (!lexer->allowComments) {
                    unreadChar(lexer, offset);
                    lexer->error = yajl_lex_unallowed_comment;
                    tok = yajl_tok_error;
                    goto lexed;
                }
                /* if comments are enabled, then we should try to lex
                 * the thing.  possible outcomes are
                 * - successful lex (tok_comment, which means continue),
                 * - malformed comment opening (slash not followed by
                 *   '*' or '/') (tok_error)
                 * - eof hit. (tok_eof) */
                tok = yajl_lex_comment(lexer, (const unsigned char *) jsonText,
                                       jsonTextLen, offset);
                if (tok == yajl_tok_comment) {
                    /* "error" is silly, but that's the initial
                     * state of tok.  guilty until proven innocent. */
                    tok = yajl_tok_error;
                    yajl_buf_clear(lexer->buf);
                    lexer->bufInUse = 0;
                    startOffset = *offset;
                    break;
                }
                /* hit error or eof, bail */
                goto lexed;
            default:
                lexer->error = yajl_lex_invalid_char;
                tok = yajl_tok_error;
                goto lexed;
        }
    }


  lexed:
    /* need to append to buffer if the buffer is in use or
     * if it's an EOF token */
    if (tok == yajl_tok_eof || lexer->bufInUse) {
        if (!lexer->bufInUse) yajl_buf_clear(lexer->buf);
        lexer->bufInUse = 1;
        yajl_buf_append(lexer->buf, jsonText + startOffset, *offset - startOffset);
        lexer->bufOff = 0;

        if (tok != yajl_tok_eof) {
            *outBuf = yajl_buf_data(lexer->buf);
            *outLen = yajl_buf_len(lexer->buf);
            lexer->bufInUse = 0;
        }
    } else if (tok != yajl_tok_error) {
        *outBuf = jsonText + startOffset;
        *outLen = *offset - startOffset;
    }

    /* special case for strings. skip the quotes. */
    if (tok == yajl_tok_string || tok == yajl_tok_string_with_escapes)
    {
        assert(*outLen >= 2);
        (*outBuf)++;
        *outLen -= 2;
    }


#ifdef YAJL_LEXER_DEBUG
    if (tok == yajl_tok_error) {
        printf("lexical error: %s\n",
               yajl_lex_error_to_string(yajl_lex_get_error(lexer)));
    } else if (tok == yajl_tok_eof) {
        printf("EOF hit\n");
    } else {
        printf("lexed %s: '", tokToStr(tok));
        fwrite(*outBuf, 1, *outLen, stdout);
        printf("'\n");
    }
#endif

    return tok;
}